

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegtran.c
# Opt level: O1

int parse_switches(j_compress_ptr cinfo,int argc,char **argv,int last_file_arg_seen,boolean for_real
                  )

{
  int *piVar1;
  boolean bVar2;
  int iVar3;
  char *arg;
  JXFORM_CODE transform;
  long *plVar5;
  char *filename;
  uint uVar6;
  char **unaff_R15;
  bool bVar7;
  char ch;
  long lval;
  byte local_41;
  ulong local_40;
  int local_38;
  int local_34;
  undefined8 *puVar4;
  
  filename = (char *)0x0;
  icc_filename = (char *)0x0;
  max_scans = 0;
  outfilename = (char *)0x0;
  report = 0;
  strict = 0;
  copyoption = JCOPYOPT_COMMENTS;
  transformoption.transform = JXFORM_NONE;
  transformoption.perfect = 0;
  transformoption.trim = 0;
  transformoption.force_grayscale = 0;
  transformoption.crop = 0;
  transformoption.slow_hflip = 0;
  cinfo->err->trace_level = 0;
  local_34 = last_file_arg_seen;
  if (1 < argc) {
    uVar6 = 1;
    filename = (char *)0x0;
    local_38 = 0;
LAB_00102c97:
    if (*argv[(int)uVar6] == '-') {
      arg = argv[(int)uVar6] + 1;
      bVar2 = keymatch(arg,"arithmetic",1);
      if (bVar2 == 0) {
        bVar2 = keymatch(arg,"copy",2);
        if (bVar2 == 0) {
          bVar2 = keymatch(arg,"crop",2);
          if (bVar2 == 0) {
            bVar2 = keymatch(arg,"drop",2);
            if (bVar2 == 0) {
              bVar2 = keymatch(arg,"debug",1);
              if ((bVar2 != 0) || (bVar2 = keymatch(arg,"verbose",1), bVar2 != 0)) {
                if (parse_switches_printed_version == '\0') {
                  parse_switches_cold_3();
                }
                piVar1 = &cinfo->err->trace_level;
                *piVar1 = *piVar1 + 1;
                goto LAB_00102cdf;
              }
              bVar2 = keymatch(arg,"version",4);
              if (bVar2 != 0) goto LAB_00103444;
              bVar2 = keymatch(arg,"flip",1);
              if (bVar2 == 0) {
                bVar2 = keymatch(arg,"grayscale",1);
                if ((bVar2 != 0) || (bVar2 = keymatch(arg,"greyscale",1), bVar2 != 0)) {
                  transformoption.force_grayscale = 1;
                  goto LAB_00102cdf;
                }
                bVar2 = keymatch(arg,"icc",1);
                if (bVar2 != 0) {
                  uVar6 = uVar6 + 1;
                  if (argc <= (int)uVar6) goto LAB_0010342a;
                  icc_filename = argv[(int)uVar6];
                  goto LAB_00102cdf;
                }
                bVar2 = keymatch(arg,"maxmemory",3);
                if (bVar2 != 0) {
                  local_41 = 0x78;
                  uVar6 = uVar6 + 1;
                  if ((argc <= (int)uVar6) ||
                     (iVar3 = __isoc99_sscanf(argv[(int)uVar6],"%ld%c",&local_40,&local_41),
                     iVar3 < 1)) goto LAB_0010342a;
                  if ((local_41 & 0xdf) == 0x4d) {
                    local_40 = local_40 * 1000;
                  }
                  cinfo->mem->max_memory_to_use = local_40 * 1000;
                  goto LAB_00102cdf;
                }
                bVar2 = keymatch(arg,"maxscans",4);
                if (bVar2 != 0) {
                  uVar6 = uVar6 + 1;
                  if ((argc <= (int)uVar6) ||
                     (iVar3 = __isoc99_sscanf(argv[(int)uVar6],"%u",&max_scans), iVar3 != 1))
                  goto LAB_0010342a;
                  goto LAB_00102cdf;
                }
                bVar2 = keymatch(arg,"optimize",1);
                if ((bVar2 != 0) || (bVar2 = keymatch(arg,"optimise",1), bVar2 != 0)) {
                  cinfo->optimize_coding = 1;
                  goto LAB_00102cdf;
                }
                bVar2 = keymatch(arg,"outfile",4);
                if (bVar2 != 0) {
                  uVar6 = uVar6 + 1;
                  if (argc <= (int)uVar6) goto LAB_0010342a;
                  outfilename = argv[(int)uVar6];
                  goto LAB_00102cdf;
                }
                bVar2 = keymatch(arg,"perfect",2);
                if (bVar2 != 0) {
                  transformoption.perfect = 1;
                  goto LAB_00102cdf;
                }
                bVar2 = keymatch(arg,"progressive",2);
                if (bVar2 != 0) {
                  local_38 = 1;
                  goto LAB_00102cdf;
                }
                bVar2 = keymatch(arg,"report",3);
                if (bVar2 != 0) {
                  report = 1;
                  goto LAB_00102cdf;
                }
                bVar2 = keymatch(arg,"restart",1);
                if (bVar2 != 0) {
                  local_41 = 0x78;
                  uVar6 = uVar6 + 1;
                  if (((argc <= (int)uVar6) ||
                      (iVar3 = __isoc99_sscanf(argv[(int)uVar6],"%ld%c",&local_40,&local_41),
                      iVar3 < 1)) || (0xffff < local_40)) goto LAB_0010342a;
                  if ((local_41 & 0xdf) == 0x42) {
                    cinfo->restart_interval = (uint)local_40;
                    cinfo->restart_in_rows = 0;
                  }
                  else {
                    cinfo->restart_in_rows = (uint)local_40;
                  }
                  goto LAB_00102cdf;
                }
                bVar2 = keymatch(arg,"rotate",2);
                if (bVar2 == 0) {
                  bVar2 = keymatch(arg,"scans",1);
                  if (bVar2 != 0) {
                    uVar6 = uVar6 + 1;
                    if (argc <= (int)uVar6) goto LAB_0010342a;
                    filename = argv[(int)uVar6];
                    goto LAB_00102cdf;
                  }
                  bVar2 = keymatch(arg,"strict",2);
                  if (bVar2 != 0) {
                    strict = 1;
                    goto LAB_00102cdf;
                  }
                  bVar2 = keymatch(arg,"transpose",1);
                  if (bVar2 == 0) {
                    bVar2 = keymatch(arg,"transverse",6);
                    if (bVar2 != 0) {
                      transform = JXFORM_TRANSVERSE;
                      goto LAB_00102e40;
                    }
                    bVar2 = keymatch(arg,"trim",3);
                    if (bVar2 != 0) {
                      transformoption.trim = 1;
                      goto LAB_00102cdf;
                    }
                    bVar2 = keymatch(arg,"wipe",1);
                    if ((bVar2 == 0) || (uVar6 = uVar6 + 1, argc <= (int)uVar6)) goto LAB_0010342a;
                    if ((transformoption.crop != 0) ||
                       (bVar2 = jtransform_parse_crop_spec(&transformoption,argv[(int)uVar6]),
                       bVar2 == 0)) goto LAB_00103449;
                    transform = JXFORM_WIPE;
                  }
                  else {
                    transform = JXFORM_TRANSPOSE;
                  }
                }
                else {
                  uVar6 = uVar6 + 1;
                  if (argc <= (int)uVar6) goto LAB_0010342a;
                  bVar2 = keymatch(argv[(int)uVar6],"90",2);
                  if (bVar2 != 0) {
                    transform = JXFORM_ROT_90;
                    goto LAB_00102e40;
                  }
                  bVar2 = keymatch(argv[(int)uVar6],"180",3);
                  if (bVar2 == 0) {
                    bVar2 = keymatch(argv[(int)uVar6],"270",3);
                    if (bVar2 == 0) goto LAB_0010342a;
                    transform = JXFORM_ROT_270;
                  }
                  else {
                    transform = JXFORM_ROT_180;
                  }
                }
              }
              else {
                uVar6 = uVar6 + 1;
                if (argc <= (int)uVar6) goto LAB_0010342a;
                bVar2 = keymatch(argv[(int)uVar6],"horizontal",1);
                if (bVar2 == 0) {
                  bVar2 = keymatch(argv[(int)uVar6],"vertical",1);
                  if (bVar2 != 0) {
                    transform = JXFORM_FLIP_V;
                    goto LAB_00102e40;
                  }
                  goto LAB_0010342a;
                }
                transform = JXFORM_FLIP_H;
              }
            }
            else {
              if (argc <= (int)(uVar6 + 1)) goto LAB_0010342a;
              if ((((transformoption.crop != 0) ||
                   (bVar2 = jtransform_parse_crop_spec(&transformoption,argv[(int)(uVar6 + 1)]),
                   bVar2 == 0)) || (transformoption.crop_width_set != JCROP_UNSET)) ||
                 (transformoption.crop_height_set != JCROP_UNSET)) goto LAB_0010343a;
              uVar6 = uVar6 + 2;
              if (argc <= (int)uVar6) goto LAB_0010342a;
              dropfilename = argv[(int)uVar6];
              transform = JXFORM_DROP;
            }
LAB_00102e40:
            select_transform(transform);
          }
          else {
            uVar6 = uVar6 + 1;
            if (argc <= (int)uVar6) goto LAB_0010342a;
            if ((transformoption.crop != 0) ||
               (bVar2 = jtransform_parse_crop_spec(&transformoption,argv[(int)uVar6]), bVar2 == 0))
            goto LAB_0010342f;
          }
        }
        else {
          uVar6 = uVar6 + 1;
          if (argc <= (int)uVar6) goto LAB_0010342a;
          bVar2 = keymatch(argv[(int)uVar6],"none",1);
          if (bVar2 == 0) {
            bVar2 = keymatch(argv[(int)uVar6],"comments",1);
            if (bVar2 == 0) {
              bVar2 = keymatch(argv[(int)uVar6],"icc",1);
              if (bVar2 == 0) {
                bVar2 = keymatch(argv[(int)uVar6],"all",1);
                if (bVar2 == 0) goto LAB_0010342a;
                copyoption = JCOPYOPT_ALL;
              }
              else {
                copyoption = JCOPYOPT_ICC;
              }
            }
            else {
              copyoption = JCOPYOPT_COMMENTS;
            }
          }
          else {
            copyoption = JCOPYOPT_NONE;
          }
        }
      }
      else {
        cinfo->arith_code = 1;
      }
    }
    else {
      if (0 < (int)uVar6) goto LAB_001033e9;
      outfilename = (char *)0x0;
    }
LAB_00102cdf:
    uVar6 = uVar6 + 1;
    if (argc <= (int)uVar6) goto LAB_001033e9;
    goto LAB_00102c97;
  }
  bVar7 = true;
  uVar6 = 1;
  goto LAB_001033f1;
LAB_001033e9:
  bVar7 = local_38 == 0;
  unaff_R15 = argv;
LAB_001033f1:
  if (local_34 != 0) {
    if (!bVar7) {
      jpeg_simple_progression(cinfo);
    }
    if ((filename != (char *)0x0) &&
       (bVar2 = read_scan_script(cinfo,filename), argv = unaff_R15, bVar2 == 0)) {
LAB_0010342a:
      usage();
LAB_0010342f:
      parse_switches_cold_1();
LAB_0010343a:
      parse_switches_cold_2();
LAB_00103444:
      parse_switches_cold_4();
LAB_00103449:
      iVar3 = (int)argv;
      plVar5 = (long *)(ulong)uVar6;
      parse_switches_cold_5();
      puVar4 = (undefined8 *)*plVar5;
      if (-1 < iVar3) {
        if (*(int *)((long)puVar4 + 0x7c) < iVar3) {
          return (int)puVar4;
        }
        puVar4 = puVar4 + 2;
      }
      iVar3 = (*(code *)*puVar4)();
      return iVar3;
    }
  }
  return uVar6;
}

Assistant:

LOCAL(int)
parse_switches(j_compress_ptr cinfo, int argc, char **argv,
               int last_file_arg_seen, boolean for_real)
/* Parse optional switches.
 * Returns argv[] index of first file-name argument (== argc if none).
 * Any file names with indexes <= last_file_arg_seen are ignored;
 * they have presumably been processed in a previous iteration.
 * (Pass 0 for last_file_arg_seen on the first or only iteration.)
 * for_real is FALSE on the first (dummy) pass; we may skip any expensive
 * processing.
 */
{
  int argn;
  char *arg;
  boolean simple_progressive;
  char *scansarg = NULL;        /* saves -scans parm if any */

  /* Set up default JPEG parameters. */
  simple_progressive = FALSE;
  icc_filename = NULL;
  max_scans = 0;
  outfilename = NULL;
  report = FALSE;
  strict = FALSE;
  copyoption = JCOPYOPT_DEFAULT;
  transformoption.transform = JXFORM_NONE;
  transformoption.perfect = FALSE;
  transformoption.trim = FALSE;
  transformoption.force_grayscale = FALSE;
  transformoption.crop = FALSE;
  transformoption.slow_hflip = FALSE;
  cinfo->err->trace_level = 0;

  /* Scan command line options, adjust parameters */

  for (argn = 1; argn < argc; argn++) {
    arg = argv[argn];
    if (*arg != '-') {
      /* Not a switch, must be a file name argument */
      if (argn <= last_file_arg_seen) {
        outfilename = NULL;     /* -outfile applies to just one input file */
        continue;               /* ignore this name if previously processed */
      }
      break;                    /* else done parsing switches */
    }
    arg++;                      /* advance past switch marker character */

    if (keymatch(arg, "arithmetic", 1)) {
      /* Use arithmetic coding. */
#ifdef C_ARITH_CODING_SUPPORTED
      cinfo->arith_code = TRUE;
#else
      fprintf(stderr, "%s: sorry, arithmetic coding not supported\n",
              progname);
      exit(EXIT_FAILURE);
#endif

    } else if (keymatch(arg, "copy", 2)) {
      /* Select which extra markers to copy. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (keymatch(argv[argn], "none", 1)) {
        copyoption = JCOPYOPT_NONE;
      } else if (keymatch(argv[argn], "comments", 1)) {
        copyoption = JCOPYOPT_COMMENTS;
      } else if (keymatch(argv[argn], "icc", 1)) {
        copyoption = JCOPYOPT_ICC;
      } else if (keymatch(argv[argn], "all", 1)) {
        copyoption = JCOPYOPT_ALL;
      } else
        usage();

    } else if (keymatch(arg, "crop", 2)) {
      /* Perform lossless cropping. */
#if TRANSFORMS_SUPPORTED
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (transformoption.crop /* reject multiple crop/drop/wipe requests */ ||
          !jtransform_parse_crop_spec(&transformoption, argv[argn])) {
        fprintf(stderr, "%s: bogus -crop argument '%s'\n",
                progname, argv[argn]);
        exit(EXIT_FAILURE);
      }
#else
      select_transform(JXFORM_NONE);    /* force an error */
#endif

    } else if (keymatch(arg, "drop", 2)) {
#if TRANSFORMS_SUPPORTED
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (transformoption.crop /* reject multiple crop/drop/wipe requests */ ||
          !jtransform_parse_crop_spec(&transformoption, argv[argn]) ||
          transformoption.crop_width_set != JCROP_UNSET ||
          transformoption.crop_height_set != JCROP_UNSET) {
        fprintf(stderr, "%s: bogus -drop argument '%s'\n",
                progname, argv[argn]);
        exit(EXIT_FAILURE);
      }
      if (++argn >= argc)       /* advance to next argument */
        usage();
      dropfilename = argv[argn];
      select_transform(JXFORM_DROP);
#else
      select_transform(JXFORM_NONE);    /* force an error */
#endif

    } else if (keymatch(arg, "debug", 1) || keymatch(arg, "verbose", 1)) {
      /* Enable debug printouts. */
      /* On first -d, print version identification */
      static boolean printed_version = FALSE;

      if (!printed_version) {
        fprintf(stderr, "%s version %s (build %s)\n",
                PACKAGE_NAME, VERSION, BUILD);
        fprintf(stderr, "%s\n\n", JCOPYRIGHT);
        fprintf(stderr, "Emulating The Independent JPEG Group's software, version %s\n\n",
                JVERSION);
        printed_version = TRUE;
      }
      cinfo->err->trace_level++;

    } else if (keymatch(arg, "version", 4)) {
      fprintf(stderr, "%s version %s (build %s)\n",
              PACKAGE_NAME, VERSION, BUILD);
      exit(EXIT_SUCCESS);

    } else if (keymatch(arg, "flip", 1)) {
      /* Mirror left-right or top-bottom. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (keymatch(argv[argn], "horizontal", 1))
        select_transform(JXFORM_FLIP_H);
      else if (keymatch(argv[argn], "vertical", 1))
        select_transform(JXFORM_FLIP_V);
      else
        usage();

    } else if (keymatch(arg, "grayscale", 1) ||
               keymatch(arg, "greyscale", 1)) {
      /* Force to grayscale. */
#if TRANSFORMS_SUPPORTED
      transformoption.force_grayscale = TRUE;
#else
      select_transform(JXFORM_NONE);    /* force an error */
#endif

    } else if (keymatch(arg, "icc", 1)) {
      /* Set ICC filename. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      icc_filename = argv[argn];

    } else if (keymatch(arg, "maxmemory", 3)) {
      /* Maximum memory in Kb (or Mb with 'm'). */
      long lval;
      char ch = 'x';

      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (sscanf(argv[argn], "%ld%c", &lval, &ch) < 1)
        usage();
      if (ch == 'm' || ch == 'M')
        lval *= 1000L;
      cinfo->mem->max_memory_to_use = lval * 1000L;

    } else if (keymatch(arg, "maxscans", 4)) {
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (sscanf(argv[argn], "%u", &max_scans) != 1)
        usage();

    } else if (keymatch(arg, "optimize", 1) || keymatch(arg, "optimise", 1)) {
      /* Enable entropy parm optimization. */
#ifdef ENTROPY_OPT_SUPPORTED
      cinfo->optimize_coding = TRUE;
#else
      fprintf(stderr, "%s: sorry, entropy optimization was not compiled\n",
              progname);
      exit(EXIT_FAILURE);
#endif

    } else if (keymatch(arg, "outfile", 4)) {
      /* Set output file name. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      outfilename = argv[argn]; /* save it away for later use */

    } else if (keymatch(arg, "perfect", 2)) {
      /* Fail if there is any partial edge MCUs that the transform can't
       * handle. */
      transformoption.perfect = TRUE;

    } else if (keymatch(arg, "progressive", 2)) {
      /* Select simple progressive mode. */
#ifdef C_PROGRESSIVE_SUPPORTED
      simple_progressive = TRUE;
      /* We must postpone execution until num_components is known. */
#else
      fprintf(stderr, "%s: sorry, progressive output was not compiled\n",
              progname);
      exit(EXIT_FAILURE);
#endif

    } else if (keymatch(arg, "report", 3)) {
      report = TRUE;

    } else if (keymatch(arg, "restart", 1)) {
      /* Restart interval in MCU rows (or in MCUs with 'b'). */
      long lval;
      char ch = 'x';

      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (sscanf(argv[argn], "%ld%c", &lval, &ch) < 1)
        usage();
      if (lval < 0 || lval > 65535L)
        usage();
      if (ch == 'b' || ch == 'B') {
        cinfo->restart_interval = (unsigned int)lval;
        cinfo->restart_in_rows = 0; /* else prior '-restart n' overrides me */
      } else {
        cinfo->restart_in_rows = (int)lval;
        /* restart_interval will be computed during startup */
      }

    } else if (keymatch(arg, "rotate", 2)) {
      /* Rotate 90, 180, or 270 degrees (measured clockwise). */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (keymatch(argv[argn], "90", 2))
        select_transform(JXFORM_ROT_90);
      else if (keymatch(argv[argn], "180", 3))
        select_transform(JXFORM_ROT_180);
      else if (keymatch(argv[argn], "270", 3))
        select_transform(JXFORM_ROT_270);
      else
        usage();

    } else if (keymatch(arg, "scans", 1)) {
      /* Set scan script. */
#ifdef C_MULTISCAN_FILES_SUPPORTED
      if (++argn >= argc)       /* advance to next argument */
        usage();
      scansarg = argv[argn];
      /* We must postpone reading the file in case -progressive appears. */
#else
      fprintf(stderr, "%s: sorry, multi-scan output was not compiled\n",
              progname);
      exit(EXIT_FAILURE);
#endif

    } else if (keymatch(arg, "strict", 2)) {
      strict = TRUE;

    } else if (keymatch(arg, "transpose", 1)) {
      /* Transpose (across UL-to-LR axis). */
      select_transform(JXFORM_TRANSPOSE);

    } else if (keymatch(arg, "transverse", 6)) {
      /* Transverse transpose (across UR-to-LL axis). */
      select_transform(JXFORM_TRANSVERSE);

    } else if (keymatch(arg, "trim", 3)) {
      /* Trim off any partial edge MCUs that the transform can't handle. */
      transformoption.trim = TRUE;

    } else if (keymatch(arg, "wipe", 1)) {
#if TRANSFORMS_SUPPORTED
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (transformoption.crop /* reject multiple crop/drop/wipe requests */ ||
          !jtransform_parse_crop_spec(&transformoption, argv[argn])) {
        fprintf(stderr, "%s: bogus -wipe argument '%s'\n",
                progname, argv[argn]);
        exit(EXIT_FAILURE);
      }
      select_transform(JXFORM_WIPE);
#else
      select_transform(JXFORM_NONE);    /* force an error */
#endif

    } else {
      usage();                  /* bogus switch */
    }
  }

  /* Post-switch-scanning cleanup */

  if (for_real) {

#ifdef C_PROGRESSIVE_SUPPORTED
    if (simple_progressive)     /* process -progressive; -scans can override */
      jpeg_simple_progression(cinfo);
#endif

#ifdef C_MULTISCAN_FILES_SUPPORTED
    if (scansarg != NULL)       /* process -scans if it was present */
      if (!read_scan_script(cinfo, scansarg))
        usage();
#endif
  }

  return argn;                  /* return index of next arg (file name) */
}